

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

void d68010_movec(void)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  char *local_20;
  char *processor;
  char *reg_name;
  uint extension;
  
  if ((g_cpu_type & 0x1e) == 0) {
    if ((g_cpu_ir & 0xf000) == 0xf000) {
      d68000_1111();
    }
    else {
      d68000_illegal();
    }
  }
  else {
    uVar1 = dasm_read_imm_16(2);
    uVar2 = uVar1 & 0xfff;
    if (uVar2 == 0) {
      processor = "SFC";
      local_20 = "1+";
    }
    else if (uVar2 == 1) {
      processor = "DFC";
      local_20 = "1+";
    }
    else if (uVar2 == 2) {
      processor = "CACR";
      local_20 = "2+";
    }
    else if (uVar2 == 3) {
      processor = "TC";
      local_20 = "4+";
    }
    else if (uVar2 == 4) {
      processor = "ITT0";
      local_20 = "4+";
    }
    else if (uVar2 == 5) {
      processor = "ITT1";
      local_20 = "4+";
    }
    else if (uVar2 == 6) {
      processor = "DTT0";
      local_20 = "4+";
    }
    else if (uVar2 == 7) {
      processor = "DTT1";
      local_20 = "4+";
    }
    else if (uVar2 == 0x800) {
      processor = "USP";
      local_20 = "1+";
    }
    else if (uVar2 == 0x801) {
      processor = "VBR";
      local_20 = "1+";
    }
    else if (uVar2 == 0x802) {
      processor = "CAAR";
      local_20 = "2,3";
    }
    else if (uVar2 == 0x803) {
      processor = "MSP";
      local_20 = "2+";
    }
    else if (uVar2 == 0x804) {
      processor = "ISP";
      local_20 = "2+";
    }
    else if (uVar2 == 0x805) {
      processor = "MMUSR";
      local_20 = "4+";
    }
    else if (uVar2 == 0x806) {
      processor = "URP";
      local_20 = "4+";
    }
    else if (uVar2 == 0x807) {
      processor = "SRP";
      local_20 = "4+";
    }
    else {
      processor = make_signed_hex_str_16(uVar1 & 0xfff);
      local_20 = "?";
    }
    if ((g_cpu_ir & 1) == 0) {
      uVar3 = 0x44;
      if ((uVar1 & 0x8000) != 0) {
        uVar3 = 0x41;
      }
      sprintf(g_dasm_str,"movec   %s, %c%d; (%s)",processor,uVar3,(ulong)(uVar1 >> 0xc & 7),local_20
             );
    }
    else {
      uVar3 = 0x44;
      if ((uVar1 & 0x8000) != 0) {
        uVar3 = 0x41;
      }
      sprintf(g_dasm_str,"movec   %c%d, %s; (%s)",uVar3,(ulong)(uVar1 >> 0xc & 7),processor,local_20
             );
    }
  }
  return;
}

Assistant:

static void d68010_movec(void)
{
	uint extension;
	char* reg_name;
	char* processor;
	LIMIT_CPU_TYPES(M68010_PLUS);
	extension = read_imm_16();

	switch(extension & 0xfff)
	{
		case 0x000:
			reg_name = "SFC";
			processor = "1+";
			break;
		case 0x001:
			reg_name = "DFC";
			processor = "1+";
			break;
		case 0x800:
			reg_name = "USP";
			processor = "1+";
			break;
		case 0x801:
			reg_name = "VBR";
			processor = "1+";
			break;
		case 0x002:
			reg_name = "CACR";
			processor = "2+";
			break;
		case 0x802:
			reg_name = "CAAR";
			processor = "2,3";
			break;
		case 0x803:
			reg_name = "MSP";
			processor = "2+";
			break;
		case 0x804:
			reg_name = "ISP";
			processor = "2+";
			break;
		case 0x003:
			reg_name = "TC";
			processor = "4+";
			break;
		case 0x004:
			reg_name = "ITT0";
			processor = "4+";
			break;
		case 0x005:
			reg_name = "ITT1";
			processor = "4+";
			break;
		case 0x006:
			reg_name = "DTT0";
			processor = "4+";
			break;
		case 0x007:
			reg_name = "DTT1";
			processor = "4+";
			break;
		case 0x805:
			reg_name = "MMUSR";
			processor = "4+";
			break;
		case 0x806:
			reg_name = "URP";
			processor = "4+";
			break;
		case 0x807:
			reg_name = "SRP";
			processor = "4+";
			break;
		default:
			reg_name = make_signed_hex_str_16(extension & 0xfff);
			processor = "?";
	}

	if(BIT_0(g_cpu_ir))
		sprintf(g_dasm_str, "movec   %c%d, %s; (%s)", BIT_F(extension) ? 'A' : 'D', (extension>>12)&7, reg_name, processor);
	else
		sprintf(g_dasm_str, "movec   %s, %c%d; (%s)", reg_name, BIT_F(extension) ? 'A' : 'D', (extension>>12)&7, processor);
}